

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

_Bool google_protobuf_MessageOptions_message_set_wire_format(google_protobuf_MessageOptions *msg)

{
  _Bool _Var1;
  ulong in_RAX;
  _Bool ret;
  _Bool default_val;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_004381dc,(void *)((long)&uStack_18 + 7));
  if (!_Var1) {
    _Var1 = upb_Message_HasBaseField
                      (&msg->base_dont_copy_me__upb_internal_use_only,
                       (upb_MiniTableField *)&DAT_004381dc);
    if (!_Var1) {
      uStack_18._6_1_ = 0;
      goto LAB_002b47bc;
    }
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)&DAT_004381dc,(void *)((long)&uStack_18 + 6),
             (void *)((long)&msg[1].base_dont_copy_me__upb_internal_use_only.field_0 + 1));
LAB_002b47bc:
  return (_Bool)(uStack_18._6_1_ & 1);
}

Assistant:

UPB_INLINE bool google_protobuf_MessageOptions_message_set_wire_format(const google_protobuf_MessageOptions* msg) {
  bool default_val = false;
  bool ret;
  const upb_MiniTableField field = {1, 9, 64, kUpb_NoSub, 8, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_1Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}